

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

longlong GeneratedSaxParser::Utils::toInteger<long_long,true>(ParserChar *buffer,bool *failed)

{
  bool bVar1;
  uint uVar2;
  undefined1 *in_RSI;
  char *in_RDI;
  bool digitFound;
  longlong sign;
  longlong value;
  ParserChar *s;
  long local_30;
  long local_28;
  char *local_20;
  
  if (in_RDI == (char *)0x0) {
    *in_RSI = 1;
  }
  else {
    local_20 = in_RDI;
    if (*in_RDI == '\0') {
      *in_RSI = 1;
    }
    else {
      do {
        bVar1 = isWhiteSpace(*local_20);
        if (!bVar1) {
          local_28 = 0;
          local_30 = 1;
          if (*local_20 == '-') {
            local_20 = local_20 + 1;
            local_30 = -1;
          }
          else if (*local_20 == '+') {
            local_20 = local_20 + 1;
          }
          bVar1 = false;
          while( true ) {
            if (*local_20 == '\0') {
              *in_RSI = 0;
              return local_28 * local_30;
            }
            uVar2 = isdigit((int)*local_20);
            if ((uVar2 & 1) == 0) break;
            local_28 = local_28 * 10 + (long)(*local_20 + -0x30);
            bVar1 = true;
            local_20 = local_20 + 1;
          }
          if (bVar1) {
            *in_RSI = 0;
            return local_28 * local_30;
          }
          *in_RSI = 1;
          return 0;
        }
        local_20 = local_20 + 1;
      } while (*local_20 != '\0');
      *in_RSI = 1;
    }
  }
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}